

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall SuiteSessionTests::MsgWithBadType::MsgWithBadType(MsgWithBadType *this)

{
  long *local_98;
  long local_90;
  long local_88 [2];
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  char local_58 [16];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  size_t local_28;
  int local_20;
  
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"*","");
  local_78._0_8_ = &PTR__FieldBase_00323d68;
  local_78._8_4_ = 0x23;
  local_68._M_p = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_98,local_90 + (long)local_98);
  local_48._M_p = (pointer)&local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_28 = 0;
  local_20 = 0;
  local_78._0_8_ = &PTR__FieldBase_00324788;
  FIX42::Message::Message(&this->super_Message,(MsgType *)local_78);
  FIX::FieldBase::~FieldBase((FieldBase *)local_78);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  *(undefined ***)&this->super_Message = &PTR__Message_00327648;
  return;
}

Assistant:

MsgWithBadType() : FIX42::Message( MsgType( "*" ) ) {}